

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  ImGuiWindow *candidate_window;
  int i;
  ImGuiContext *g;
  int in_stack_ffffffffffffffcc;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  int local_24;
  
  local_24 = (GImGui->Windows).Size;
  while( true ) {
    local_24 = local_24 + -1;
    if (local_24 < 0) {
      return false;
    }
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd0 = *ppIVar1;
    if (in_stack_ffffffffffffffd0 == in_RDI) break;
    if (in_stack_ffffffffffffffd0 == in_RSI) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}